

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O2

bool __thiscall glu::ES2ContextInfo::isVertexDynamicLoopSupported(ES2ContextInfo *this)

{
  bool *pbVar1;
  
  pbVar1 = CachedValue<bool,_glu::TryCompileProgram>::getValue
                     (&this->m_vertexDynamicLoopsSupported,(this->super_ContextInfo).m_context);
  return *pbVar1;
}

Assistant:

bool								isVertexDynamicLoopSupported		(void) const	{ return m_vertexDynamicLoopsSupported.getValue(m_context);		}